

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O2

void __thiscall spvtools::opt::LoopFusion::Fuse(LoopFusion *this)

{
  BasicBlock *pBVar1;
  IRContext *this_00;
  pointer ppLVar2;
  pointer ppIVar3;
  pointer ppLVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t bb_id;
  uint32_t bb_id_00;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t after;
  BasicBlock *pBVar9;
  BasicBlock *this_01;
  DefUseManager *pDVar10;
  CFG *this_02;
  Instruction *pIVar11;
  LoopDescriptor *this_03;
  Loop *pLVar12;
  Loop *pLVar13;
  Instruction *instruction;
  pointer ppLVar14;
  pointer ppLVar15;
  Instruction **it;
  __node_base *p_Var16;
  pointer ppIVar17;
  iterator iVar18;
  BasicBlockListTy loop_1_blocks;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_98
  ;
  BasicBlock *local_80;
  BasicBlock *local_78;
  BasicBlock *local_70;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_68
  ;
  _Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> local_48;
  
  bVar5 = AreCompatible(this);
  if (!bVar5) {
    __assert_fail("AreCompatible() && \"Can\'t fuse, loops aren\'t compatible\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp"
                  ,0x216,"void spvtools::opt::LoopFusion::Fuse()");
  }
  bVar5 = IsLegal(this);
  if (bVar5) {
    uVar6 = BasicBlock::id(this->loop_1_->loop_header_);
    pBVar9 = Loop::FindConditionBlock(this->loop_1_);
    bb_id = BasicBlock::id(pBVar9);
    bb_id_00 = BasicBlock::id(this->loop_1_->loop_continue_);
    uVar7 = BasicBlock::id(this->loop_0_->loop_continue_);
    this_01 = Loop::FindConditionBlock(this->loop_0_);
    iVar18 = opt::Function::FindBlock(this->containing_function_,bb_id);
    pBVar9 = iVar18.iterator_._M_current._M_current[1]._M_t.
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    iVar18 = opt::Function::FindBlock(this->containing_function_,bb_id_00);
    pBVar1 = iVar18.iterator_._M_current._M_current[-1]._M_t.
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    iVar18 = opt::Function::FindBlock(this->containing_function_,uVar7);
    local_78 = iVar18.iterator_._M_current._M_current[-1]._M_t.
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    loop_1_blocks._M_h._M_bucket_count = 0;
    loop_1_blocks._M_h._M_element_count =
         (size_type)
         std::
         _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:551:7)>
         ::_M_invoke;
    loop_1_blocks._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         std::
         _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:551:7)>
         ::_M_manager;
    loop_1_blocks._M_h._M_buckets = (__buckets_ptr)pBVar9;
    local_80 = pBVar9;
    BasicBlock::ForEachSuccessorLabel(local_78,(function<void_(unsigned_int_*)> *)&loop_1_blocks);
    if (loop_1_blocks._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      (*(code *)loop_1_blocks._M_h._M_before_begin._M_nxt)(&loop_1_blocks,&loop_1_blocks,3);
    }
    loop_1_blocks._M_h._M_bucket_count = 0;
    loop_1_blocks._M_h._M_element_count =
         (size_type)
         std::
         _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:556:7)>
         ::_M_invoke;
    loop_1_blocks._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         std::
         _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:556:7)>
         ::_M_manager;
    loop_1_blocks._M_h._M_buckets = (__buckets_ptr)this;
    BasicBlock::ForEachSuccessorLabel(pBVar1,(function<void_(unsigned_int_*)> *)&loop_1_blocks);
    if (loop_1_blocks._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      (*(code *)loop_1_blocks._M_h._M_before_begin._M_nxt)(&loop_1_blocks,&loop_1_blocks,3);
    }
    loop_1_blocks._M_h._M_bucket_count = 0;
    loop_1_blocks._M_h._M_element_count =
         (size_type)
         std::
         _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:560:42)>
         ::_M_invoke;
    loop_1_blocks._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         std::
         _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:560:42)>
         ::_M_manager;
    loop_1_blocks._M_h._M_buckets = (__buckets_ptr)this;
    local_70 = pBVar1;
    BasicBlock::ForEachInst
              (this->loop_0_->loop_header_,
               (function<void_(spvtools::opt::Instruction_*)> *)&loop_1_blocks,false);
    if (loop_1_blocks._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      (*(code *)loop_1_blocks._M_h._M_before_begin._M_nxt)(&loop_1_blocks,&loop_1_blocks,3);
    }
    loop_1_blocks._M_h._M_bucket_count = 0;
    loop_1_blocks._M_h._M_element_count =
         (size_type)
         std::
         _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:568:37)>
         ::_M_invoke;
    loop_1_blocks._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         std::
         _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:568:37)>
         ::_M_manager;
    loop_1_blocks._M_h._M_buckets = (__buckets_ptr)this;
    BasicBlock::ForEachInst
              (this_01,(function<void_(spvtools::opt::Instruction_*)> *)&loop_1_blocks,false);
    if (loop_1_blocks._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      (*(code *)loop_1_blocks._M_h._M_before_begin._M_nxt)(&loop_1_blocks,&loop_1_blocks,3);
    }
    local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pBVar9 = this->loop_1_->loop_header_;
    pIVar11 = &(pBVar9->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    while (ppIVar3 = local_98._M_impl.super__Vector_impl_data._M_finish,
          pIVar11 = *(Instruction **)
                     ((long)&pIVar11->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
          ppIVar17 = local_98._M_impl.super__Vector_impl_data._M_start,
          pIVar11 != &(pBVar9->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
      if ((pIVar11->opcode_ == OpPhi) && (pIVar11 != this->induction_1_)) {
        loop_1_blocks._M_h._M_buckets = (__buckets_ptr)pIVar11;
        std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
        emplace_back<spvtools::opt::Instruction*>
                  ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                    *)&local_98,(Instruction **)&loop_1_blocks);
      }
    }
    for (; ppIVar17 != ppIVar3; ppIVar17 = ppIVar17 + 1) {
      utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList
                (&(*ppIVar17)->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
      utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
                (&(*ppIVar17)->super_IntrusiveNodeBase<spvtools::opt::Instruction>,
                 this->induction_0_);
    }
    loop_1_blocks._M_h._M_bucket_count = 0;
    loop_1_blocks._M_h._M_element_count =
         (size_type)
         std::
         _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:596:45)>
         ::_M_invoke;
    loop_1_blocks._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         std::
         _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:596:45)>
         ::_M_manager;
    loop_1_blocks._M_h._M_buckets = (__buckets_ptr)this;
    BasicBlock::ForEachPhiInst
              (this->loop_0_->loop_header_,
               (function<void_(spvtools::opt::Instruction_*)> *)&loop_1_blocks,false);
    ppIVar17 = local_98._M_impl.super__Vector_impl_data._M_start;
    ppIVar3 = local_98._M_impl.super__Vector_impl_data._M_finish;
    if (loop_1_blocks._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      (*(code *)loop_1_blocks._M_h._M_before_begin._M_nxt)(&loop_1_blocks,&loop_1_blocks,3);
      ppIVar17 = local_98._M_impl.super__Vector_impl_data._M_start;
      ppIVar3 = local_98._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; this_00 = this->context_, ppIVar17 != ppIVar3; ppIVar17 = ppIVar17 + 1) {
      IRContext::set_instr_block(this_00,*ppIVar17,this->loop_0_->loop_header_);
      pDVar10 = IRContext::get_def_use_mgr(this->context_);
      analysis::DefUseManager::AnalyzeInstUse(pDVar10,*ppIVar17);
    }
    uVar8 = Instruction::result_id(this->induction_1_);
    after = Instruction::result_id(this->induction_0_);
    IRContext::ReplaceAllUsesWith(this_00,uVar8,after);
    loop_1_blocks._M_h._M_bucket_count = 0;
    loop_1_blocks._M_h._M_element_count =
         (size_type)
         std::
         _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:616:44)>
         ::_M_invoke;
    loop_1_blocks._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         std::
         _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:616:44)>
         ::_M_manager;
    loop_1_blocks._M_h._M_buckets = (__buckets_ptr)this;
    BasicBlock::ForEachPhiInst
              (this->loop_0_->loop_merge_,
               (function<void_(spvtools::opt::Instruction_*)> *)&loop_1_blocks,false);
    if (loop_1_blocks._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      (*(code *)loop_1_blocks._M_h._M_before_begin._M_nxt)(&loop_1_blocks,&loop_1_blocks,3);
    }
    loop_1_blocks._M_h._M_bucket_count = 0;
    loop_1_blocks._M_h._M_element_count =
         (size_type)
         std::
         _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:623:7)>
         ::_M_invoke;
    loop_1_blocks._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         std::
         _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp:623:7)>
         ::_M_manager;
    loop_1_blocks._M_h._M_buckets = (__buckets_ptr)this_01;
    BasicBlock::ForEachPhiInst
              (this->loop_1_->loop_merge_,
               (function<void_(spvtools::opt::Instruction_*)> *)&loop_1_blocks,false);
    if (loop_1_blocks._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      (*(code *)loop_1_blocks._M_h._M_before_begin._M_nxt)(&loop_1_blocks,&loop_1_blocks,3);
    }
    pBVar1 = local_70;
    opt::Function::MoveBasicBlockToAfter(this->containing_function_,uVar7,local_70);
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    anon_unknown_21::AddInstructionsInBlock
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&local_68,this->loop_1_->loop_preheader_);
    anon_unknown_21::AddInstructionsInBlock
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&local_68,this->loop_1_->loop_header_);
    pBVar9 = Loop::FindConditionBlock(this->loop_1_);
    anon_unknown_21::AddInstructionsInBlock
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&local_68,pBVar9);
    anon_unknown_21::AddInstructionsInBlock
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&local_68,this->loop_1_->loop_continue_);
    pBVar9 = this->loop_0_->loop_merge_;
    if (pBVar9 != this->loop_1_->loop_preheader_) {
      anon_unknown_21::AddInstructionsInBlock
                ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&local_68,pBVar9);
    }
    this_02 = IRContext::cfg(this->context_);
    CFG::ForgetBlock(this_02,this->loop_1_->loop_preheader_);
    CFG::ForgetBlock(this_02,this->loop_1_->loop_header_);
    pBVar9 = Loop::FindConditionBlock(this->loop_1_);
    CFG::ForgetBlock(this_02,pBVar9);
    CFG::ForgetBlock(this_02,this->loop_1_->loop_continue_);
    pBVar9 = this->loop_0_->loop_merge_;
    if (pBVar9 != this->loop_1_->loop_preheader_) {
      CFG::ForgetBlock(this_02,pBVar9);
    }
    pBVar9 = local_78;
    uVar7 = BasicBlock::id(local_78);
    uVar8 = BasicBlock::id(this->loop_0_->loop_continue_);
    CFG::RemoveEdge(this_02,uVar7,uVar8);
    uVar7 = BasicBlock::id(pBVar9);
    uVar8 = BasicBlock::id(local_80);
    CFG::AddEdge(this_02,uVar7,uVar8);
    uVar7 = BasicBlock::id(pBVar1);
    uVar8 = BasicBlock::id(this->loop_0_->loop_continue_);
    CFG::AddEdge(this_02,uVar7,uVar8);
    uVar7 = BasicBlock::id(this->loop_0_->loop_continue_);
    uVar8 = BasicBlock::id(this->loop_1_->loop_header_);
    CFG::AddEdge(this_02,uVar7,uVar8);
    uVar7 = BasicBlock::id(this_01);
    uVar8 = BasicBlock::id(this->loop_1_->loop_merge_);
    CFG::AddEdge(this_02,uVar7,uVar8);
    pDVar10 = IRContext::get_def_use_mgr(this->context_);
    pIVar11 = BasicBlock::terminator(pBVar9);
    analysis::DefUseManager::AnalyzeInstUse(pDVar10,pIVar11);
    pIVar11 = BasicBlock::terminator(pBVar1);
    analysis::DefUseManager::AnalyzeInstUse(pDVar10,pIVar11);
    pIVar11 = BasicBlock::GetLoopMergeInst(this->loop_0_->loop_header_);
    analysis::DefUseManager::AnalyzeInstUse(pDVar10,pIVar11);
    pIVar11 = BasicBlock::terminator(this_01);
    analysis::DefUseManager::AnalyzeInstUse(pDVar10,pIVar11);
    this_03 = IRContext::GetLoopDescriptor(this->context_,this->containing_function_);
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppLVar2 = (this->loop_1_->nested_loops_).
              super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppLVar14 = (this->loop_1_->nested_loops_).
                    super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        ppLVar4 = local_48._M_impl.super__Vector_impl_data._M_finish,
        ppLVar15 = local_48._M_impl.super__Vector_impl_data._M_start, ppLVar14 != ppLVar2;
        ppLVar14 = ppLVar14 + 1) {
      loop_1_blocks._M_h._M_buckets = (__buckets_ptr)*ppLVar14;
      std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::push_back
                ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)&local_48,
                 (value_type *)&loop_1_blocks);
    }
    for (; ppLVar15 != ppLVar4; ppLVar15 = ppLVar15 + 1) {
      pLVar12 = *ppLVar15;
      Loop::RemoveChildLoop(this->loop_1_,pLVar12);
      Loop::AddNestedLoop(this->loop_0_,pLVar12);
    }
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_Hashtable(&loop_1_blocks._M_h,&(this->loop_1_->loop_basic_blocks_)._M_h);
    p_Var16 = &loop_1_blocks._M_h._M_before_begin;
    while (p_Var16 = p_Var16->_M_nxt, p_Var16 != (__node_base *)0x0) {
      uVar7 = (uint32_t)*(size_type *)(p_Var16 + 1);
      Loop::RemoveBasicBlock(this->loop_1_,uVar7);
      if (((uVar7 != bb_id_00) && (uVar7 != uVar6)) && (uVar7 != bb_id)) {
        Loop::AddBasicBlock(this->loop_0_,uVar7);
        pLVar12 = LoopDescriptor::FindLoopForBasicBlock(this_03,uVar7);
        if (pLVar12 == this->loop_1_) {
          LoopDescriptor::SetBasicBlockToLoop(this_03,uVar7,this->loop_0_);
        }
      }
      pLVar12 = LoopDescriptor::FindLoopForBasicBlock(this_03,uVar7);
      if (pLVar12 == this->loop_1_) {
        LoopDescriptor::ForgetBasicBlock(this_03,uVar7);
      }
    }
    pLVar12 = this->loop_1_;
    uVar6 = BasicBlock::id(pLVar12->loop_preheader_);
    Loop::RemoveBasicBlock(pLVar12,uVar6);
    uVar6 = BasicBlock::id(this->loop_1_->loop_preheader_);
    LoopDescriptor::ForgetBasicBlock(this_03,uVar6);
    pLVar12 = this->loop_0_;
    pLVar13 = this->loop_1_;
    if (pLVar12->loop_merge_ != pLVar13->loop_preheader_) {
      uVar6 = BasicBlock::id(pLVar12->loop_merge_);
      Loop::RemoveBasicBlock(pLVar12,uVar6);
      uVar6 = BasicBlock::id(this->loop_0_->loop_merge_);
      LoopDescriptor::ForgetBasicBlock(this_03,uVar6);
      pLVar12 = this->loop_0_;
      pLVar13 = this->loop_1_;
    }
    Loop::SetMergeBlock(pLVar12,pLVar13->loop_merge_);
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear(&(this->loop_1_->loop_basic_blocks_)._M_h);
    LoopDescriptor::RemoveLoop(this_03,this->loop_1_);
    ppIVar3 = local_68._M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar17 = local_68._M_impl.super__Vector_impl_data._M_start; ppIVar17 != ppIVar3;
        ppIVar17 = ppIVar17 + 1) {
      IRContext::KillInst(this->context_,*ppIVar17);
    }
    opt::Function::RemoveEmptyBlocks(this->containing_function_);
    IRContext::InvalidateAnalysesExceptFor
              (this->context_,
               kAnalysisLoopAnalysis|kAnalysisCFG|kAnalysisInstrToBlockMapping|kAnalysisBegin);
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&loop_1_blocks._M_h);
    std::_Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::~_Vector_base
              (&local_48);
    std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~_Vector_base(&local_68);
    std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~_Vector_base(&local_98);
    return;
  }
  __assert_fail("IsLegal() && \"Can\'t fuse, illegal\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fusion.cpp"
                ,0x217,"void spvtools::opt::LoopFusion::Fuse()");
}

Assistant:

void LoopFusion::Fuse() {
  assert(AreCompatible() && "Can't fuse, loops aren't compatible");
  assert(IsLegal() && "Can't fuse, illegal");

  // Save the pointers/ids, won't be found in the middle of doing modifications.
  auto header_1 = loop_1_->GetHeaderBlock()->id();
  auto condition_1 = loop_1_->FindConditionBlock()->id();
  auto continue_1 = loop_1_->GetContinueBlock()->id();
  auto continue_0 = loop_0_->GetContinueBlock()->id();
  auto condition_block_of_0 = loop_0_->FindConditionBlock();

  // Find the blocks whose branches need updating.
  auto first_block_of_1 = &*(++containing_function_->FindBlock(condition_1));
  auto last_block_of_1 = &*(--containing_function_->FindBlock(continue_1));
  auto last_block_of_0 = &*(--containing_function_->FindBlock(continue_0));

  // Update the branch for |last_block_of_loop_0| to go to |first_block_of_1|.
  last_block_of_0->ForEachSuccessorLabel(
      [first_block_of_1](uint32_t* succ) { *succ = first_block_of_1->id(); });

  // Update the branch for the |last_block_of_loop_1| to go to the continue
  // block of |loop_0_|.
  last_block_of_1->ForEachSuccessorLabel(
      [this](uint32_t* succ) { *succ = loop_0_->GetContinueBlock()->id(); });

  // Update merge block id in the header of |loop_0_| to the merge block of
  // |loop_1_|.
  loop_0_->GetHeaderBlock()->ForEachInst([this](Instruction* inst) {
    if (inst->opcode() == spv::Op::OpLoopMerge) {
      inst->SetInOperand(0, {loop_1_->GetMergeBlock()->id()});
    }
  });

  // Update condition branch target in |loop_0_| to the merge block of
  // |loop_1_|.
  condition_block_of_0->ForEachInst([this](Instruction* inst) {
    if (inst->opcode() == spv::Op::OpBranchConditional) {
      auto loop_0_merge_block_id = loop_0_->GetMergeBlock()->id();

      if (inst->GetSingleWordInOperand(1) == loop_0_merge_block_id) {
        inst->SetInOperand(1, {loop_1_->GetMergeBlock()->id()});
      } else {
        inst->SetInOperand(2, {loop_1_->GetMergeBlock()->id()});
      }
    }
  });

  // Move OpPhi instructions not corresponding to the induction variable from
  // the header of |loop_1_| to the header of |loop_0_|.
  std::vector<Instruction*> instructions_to_move{};
  for (auto& instruction : *loop_1_->GetHeaderBlock()) {
    if (instruction.opcode() == spv::Op::OpPhi &&
        &instruction != induction_1_) {
      instructions_to_move.push_back(&instruction);
    }
  }

  for (auto& it : instructions_to_move) {
    it->RemoveFromList();
    it->InsertBefore(induction_0_);
  }

  // Update the OpPhi parents to the correct blocks in |loop_0_|.
  loop_0_->GetHeaderBlock()->ForEachPhiInst([this](Instruction* i) {
    ReplacePhiParentWith(i, loop_1_->GetPreHeaderBlock()->id(),
                         loop_0_->GetPreHeaderBlock()->id());

    ReplacePhiParentWith(i, loop_1_->GetContinueBlock()->id(),
                         loop_0_->GetContinueBlock()->id());
  });

  // Update instruction to block mapping & DefUseManager.
  for (auto& phi_instruction : instructions_to_move) {
    context_->set_instr_block(phi_instruction, loop_0_->GetHeaderBlock());
    context_->get_def_use_mgr()->AnalyzeInstUse(phi_instruction);
  }

  // Replace the uses of the induction variable of |loop_1_| with that the
  // induction variable of |loop_0_|.
  context_->ReplaceAllUsesWith(induction_1_->result_id(),
                               induction_0_->result_id());

  // Replace LCSSA OpPhi in merge block of |loop_0_|.
  loop_0_->GetMergeBlock()->ForEachPhiInst([this](Instruction* instruction) {
    context_->ReplaceAllUsesWith(instruction->result_id(),
                                 instruction->GetSingleWordInOperand(0));
  });

  // Update LCSSA OpPhi in merge block of |loop_1_|.
  loop_1_->GetMergeBlock()->ForEachPhiInst(
      [condition_block_of_0](Instruction* instruction) {
        instruction->SetInOperand(1, {condition_block_of_0->id()});
      });

  // Move the continue block of |loop_0_| after the last block of |loop_1_|.
  containing_function_->MoveBasicBlockToAfter(continue_0, last_block_of_1);

  // Gather all instructions to be killed from |loop_1_| (induction variable
  // initialisation, header, condition and continue blocks).
  std::vector<Instruction*> instr_to_delete{};
  AddInstructionsInBlock(&instr_to_delete, loop_1_->GetPreHeaderBlock());
  AddInstructionsInBlock(&instr_to_delete, loop_1_->GetHeaderBlock());
  AddInstructionsInBlock(&instr_to_delete, loop_1_->FindConditionBlock());
  AddInstructionsInBlock(&instr_to_delete, loop_1_->GetContinueBlock());

  // There was an additional empty block between the loops, kill that too.
  if (loop_0_->GetMergeBlock() != loop_1_->GetPreHeaderBlock()) {
    AddInstructionsInBlock(&instr_to_delete, loop_0_->GetMergeBlock());
  }

  // Update the CFG, so it wouldn't need invalidating.
  auto cfg = context_->cfg();

  cfg->ForgetBlock(loop_1_->GetPreHeaderBlock());
  cfg->ForgetBlock(loop_1_->GetHeaderBlock());
  cfg->ForgetBlock(loop_1_->FindConditionBlock());
  cfg->ForgetBlock(loop_1_->GetContinueBlock());

  if (loop_0_->GetMergeBlock() != loop_1_->GetPreHeaderBlock()) {
    cfg->ForgetBlock(loop_0_->GetMergeBlock());
  }

  cfg->RemoveEdge(last_block_of_0->id(), loop_0_->GetContinueBlock()->id());
  cfg->AddEdge(last_block_of_0->id(), first_block_of_1->id());

  cfg->AddEdge(last_block_of_1->id(), loop_0_->GetContinueBlock()->id());

  cfg->AddEdge(loop_0_->GetContinueBlock()->id(),
               loop_1_->GetHeaderBlock()->id());

  cfg->AddEdge(condition_block_of_0->id(), loop_1_->GetMergeBlock()->id());

  // Update DefUseManager.
  auto def_use_mgr = context_->get_def_use_mgr();

  // Uses of labels that are in updated branches need analysing.
  def_use_mgr->AnalyzeInstUse(last_block_of_0->terminator());
  def_use_mgr->AnalyzeInstUse(last_block_of_1->terminator());
  def_use_mgr->AnalyzeInstUse(loop_0_->GetHeaderBlock()->GetLoopMergeInst());
  def_use_mgr->AnalyzeInstUse(condition_block_of_0->terminator());

  // Update the LoopDescriptor, so it wouldn't need invalidating.
  auto ld = context_->GetLoopDescriptor(containing_function_);

  // Create a copy, so the iterator wouldn't be invalidated.
  std::vector<Loop*> loops_to_add_remove{};
  for (auto child_loop : *loop_1_) {
    loops_to_add_remove.push_back(child_loop);
  }

  for (auto child_loop : loops_to_add_remove) {
    loop_1_->RemoveChildLoop(child_loop);
    loop_0_->AddNestedLoop(child_loop);
  }

  auto loop_1_blocks = loop_1_->GetBlocks();

  for (auto block : loop_1_blocks) {
    loop_1_->RemoveBasicBlock(block);
    if (block != header_1 && block != condition_1 && block != continue_1) {
      loop_0_->AddBasicBlock(block);
      if ((*ld)[block] == loop_1_) {
        ld->SetBasicBlockToLoop(block, loop_0_);
      }
    }

    if ((*ld)[block] == loop_1_) {
      ld->ForgetBasicBlock(block);
    }
  }

  loop_1_->RemoveBasicBlock(loop_1_->GetPreHeaderBlock()->id());
  ld->ForgetBasicBlock(loop_1_->GetPreHeaderBlock()->id());

  if (loop_0_->GetMergeBlock() != loop_1_->GetPreHeaderBlock()) {
    loop_0_->RemoveBasicBlock(loop_0_->GetMergeBlock()->id());
    ld->ForgetBasicBlock(loop_0_->GetMergeBlock()->id());
  }

  loop_0_->SetMergeBlock(loop_1_->GetMergeBlock());

  loop_1_->ClearBlocks();

  ld->RemoveLoop(loop_1_);

  // Kill unnecessary instructions and remove all empty blocks.
  for (auto inst : instr_to_delete) {
    context_->KillInst(inst);
  }

  containing_function_->RemoveEmptyBlocks();

  // Invalidate analyses.
  context_->InvalidateAnalysesExceptFor(
      IRContext::Analysis::kAnalysisInstrToBlockMapping |
      IRContext::Analysis::kAnalysisLoopAnalysis |
      IRContext::Analysis::kAnalysisDefUse | IRContext::Analysis::kAnalysisCFG);
}